

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O2

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::processDG(SDGDependenciesBuilder *this,Function *F)

{
  Value *V;
  DependenceGraph *pDVar1;
  DGBBlock *block;
  DepDGElement *this_00;
  raw_ostream *prVar2;
  DepDGElement *nd;
  pointer ppVVar3;
  Instruction *I;
  BasicBlock *pBVar4;
  Function *pFVar5;
  BasicBlock *__range3;
  Function *b;
  _Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> local_48;
  
  pDVar1 = SystemDependenceGraph::getDG(this->_sdg,F);
  for (pFVar5 = F + 0x50; pFVar5 = *(Function **)pFVar5, pFVar5 != F + 0x48; pFVar5 = pFVar5 + 8) {
    b = pFVar5 + -0x18;
    if (pFVar5 == (Function *)0x0) {
      b = (Function *)0x0;
    }
    for (pBVar4 = (BasicBlock *)b + 0x30; pBVar4 = *(BasicBlock **)pBVar4,
        pBVar4 != (BasicBlock *)b + 0x28; pBVar4 = pBVar4 + 8) {
      I = (Instruction *)(pBVar4 + -0x18);
      if (pBVar4 == (BasicBlock *)0x0) {
        I = (Instruction *)0x0;
      }
      processInstr(this,I);
    }
    block = SystemDependenceGraph::getBBlock(this->_sdg,(BasicBlock *)b);
    addControlDependencies(this,block,(BasicBlock *)b);
  }
  this_00 = (DepDGElement *)(pDVar1->_parameters).super_DGParameters._noreturn;
  if (this_00 == (DepDGElement *)0x0) {
    this_00 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
  }
  LLVMControlDependenceAnalysis::getNoReturns((ValVec *)&local_48,this->CDA,F);
  for (ppVVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppVVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; ppVVar3 = ppVVar3 + 1) {
    V = *ppVVar3;
    prVar2 = (raw_ostream *)llvm::errs();
    prVar2 = llvm::raw_ostream::operator<<(prVar2,"NORET: ");
    prVar2 = llvm::operator<<(prVar2,V);
    llvm::raw_ostream::operator<<(prVar2,"\n");
    nd = (DepDGElement *)SystemDependenceGraph::getNode(this->_sdg,V);
    if (*(int *)&nd->field_0xc < 2) {
      nd = (DepDGElement *)0x0;
    }
    if (nd != (DepDGElement *)0x0 && *(int *)&nd->field_0xc == 6) {
      nd = (DepDGElement *)
           nd[1]._use_deps.super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_node_count;
    }
    sdg::DepDGElement::addControlDep(this_00,nd);
  }
  std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void processDG(llvm::Function &F) {
        auto *dg = _sdg.getDG(&F);
        assert(dg && "Do not have dg");

        for (auto &B : F) {
            for (auto &I : B) {
                processInstr(I);
            }

            // block-based control dependencies
            addControlDependencies(_sdg.getBBlock(&B), B);
        }

        // add noreturn dependencies

        DBG(sdg, "Adding noreturn dependencies to " << F.getName().str());
        auto *noret = dg->getParameters().getNoReturn();
        if (!noret)
            noret = &dg->getParameters().createNoReturn();
        for (auto *dep : CDA->getNoReturns(&F)) {
            llvm::errs() << "NORET: " << *dep << "\n";
            auto *nd = sdg::DepDGElement::get(_sdg.getNode(dep));
            assert(nd && "Do not have the node");
            if (auto *C = sdg::DGNodeCall::get(nd)) {
                // if this is call, add it again to noret node
                auto *cnoret = C->getParameters().getNoReturn();
                assert(cnoret && "Did not create a noret for a call");
                noret->addControlDep(*cnoret);
            } else {
                noret->addControlDep(*nd);
            }
        }
    }